

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O2

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f)

{
  uint uVar1;
  undefined8 *puVar2;
  rt_variable_t *prVar3;
  int i;
  long *plVar4;
  rt_variable_getter p_Var5;
  rt_variable_setter p_Var6;
  long lVar7;
  code *pcVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  rt_list_t rVar12;
  
  if ((f->num_of_inputs & 0xfffffffeU) != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }
  puVar2 = (undefined8 *)f->local_context;
  plVar4 = (long *)(*rt_malloc_func)(0xa0);
  if (plVar4 == (long *)0x0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  *puVar2 = plVar4;
  prVar3 = *f->inputs;
  *plVar4 = (long)prVar3;
  p_Var5 = select_getter(prVar3);
  plVar4[1] = (long)p_Var5;
  prVar3 = f->inputs[1];
  plVar4[2] = (long)prVar3;
  p_Var5 = select_getter(prVar3);
  plVar4[3] = (long)p_Var5;
  prVar3 = *f->outputs;
  plVar4[6] = (long)prVar3;
  p_Var5 = select_getter(prVar3);
  plVar4[8] = (long)p_Var5;
  p_Var6 = select_setter((rt_variable_t *)plVar4[6]);
  plVar4[7] = (long)p_Var6;
  uVar11 = 0;
  if (f->num_of_inputs < 3) {
    lVar7 = 0x20;
    p_Var5 = (rt_variable_getter)0x0;
  }
  else {
    prVar3 = f->inputs[2];
    plVar4[4] = (long)prVar3;
    p_Var5 = select_getter(prVar3);
    lVar7 = 0x28;
  }
  *(rt_variable_getter *)((long)plVar4 + lVar7) = p_Var5;
  *(undefined4 *)((long)plVar4 + 0x9c) = 1;
  uVar1 = *(uint *)(puVar2 + 1);
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  iVar10 = 1;
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    iVar10 = iVar10 * *(int *)(*(long *)((int *)*plVar4 + 2) + uVar11 * 4);
    *(int *)((long)plVar4 + 0x9c) = iVar10;
  }
  iVar10 = ~uVar1 + *(int *)*plVar4;
  *(int *)(plVar4 + 0x13) = iVar10;
  rVar12 = allocate_list(iVar10);
  *(int *)(plVar4 + 9) = rVar12.size;
  plVar4[10] = (long)rVar12.data;
  rVar12 = allocate_list((int)plVar4[0x13]);
  *(int *)(plVar4 + 0xd) = rVar12.size;
  plVar4[0xe] = (long)rVar12.data;
  rVar12 = allocate_list((int)plVar4[0x13]);
  *(int *)(plVar4 + 0xb) = rVar12.size;
  plVar4[0xc] = (long)rVar12.data;
  rVar12 = allocate_list((int)plVar4[0x13]);
  *(int *)(plVar4 + 0xf) = rVar12.size;
  plVar4[0x10] = (long)rVar12.data;
  rVar12 = allocate_list((int)plVar4[0x13]);
  *(int *)(plVar4 + 0x11) = rVar12.size;
  plVar4[0x12] = (long)rVar12.data;
  for (lVar7 = 0; lVar7 < (int)plVar4[0x13]; lVar7 = lVar7 + 1) {
    *(undefined4 *)(plVar4[0xe] + lVar7 * 4) =
         *(undefined4 *)(*(long *)(plVar4[2] + 8) + 8 + lVar7 * 4);
    *(undefined4 *)(plVar4[10] + lVar7 * 4) =
         *(undefined4 *)(*(long *)(*plVar4 + 8) + 4 + (*(int *)(puVar2 + 1) + lVar7) * 4);
    *(undefined4 *)(plVar4[0xc] + lVar7 * 4) =
         *(undefined4 *)(*(long *)(plVar4[6] + 8) + 4 + (*(int *)(puVar2 + 1) + lVar7) * 4);
  }
  if ((((*(byte *)(*plVar4 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar4[6] + 0x10) & 0xf) == 0)) &&
     ((*(byte *)(plVar4[2] + 0x10) & 0xf) == 0)) {
    pcVar8 = exec_deconvolution;
    if ((plVar4[4] == 0) || ((*(byte *)(plVar4[4] + 0x10) & 0xf) == 0)) goto LAB_0011b6eb;
  }
  pcVar8 = exec_deconvolution_generic;
LAB_0011b6eb:
  f->exec_func = pcVar8;
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t allocate_deconvolution_local_context(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);

  if (f->num_of_inputs != 2 && f->num_of_inputs != 3) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }

  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  deconvolution_private_t *p = rt_malloc_func(sizeof(deconvolution_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  c->data = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);

  p->weight = f->inputs[1];
  p->get_weight = select_getter(p->weight);

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);

  if (f->num_of_inputs > 2) {
    p->bias = f->inputs[2];
    p->get_bias = select_getter(p->bias);
  } else {
    p->bias = 0;
  }

  p->base_loop_size = 1;
  for (int i = 0; i < c->base_axis; i++) {
    p->base_loop_size *= p->input->shape.data[i];
  }
  p->spatial_dims = p->input->shape.size - c->base_axis - 1;

  p->input_shape = allocate_list(p->spatial_dims);
  p->kernel_shape = allocate_list(p->spatial_dims);
  p->output_shape = allocate_list(p->spatial_dims);
  p->in_position = allocate_list(p->spatial_dims);
  p->out_position = allocate_list(p->spatial_dims);

  for (int i = 0; i < p->spatial_dims; i++) {
    p->kernel_shape.data[i] = p->weight->shape.data[i + 2];
    p->input_shape.data[i] = p->input->shape.data[i + c->base_axis + 1];
    p->output_shape.data[i] = p->output->shape.data[i + c->base_axis + 1];
  }

  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT &&
      p->weight->type == NN_DATA_TYPE_FLOAT &&
      ((p->bias && p->bias->type == NN_DATA_TYPE_FLOAT) || !p->bias)) {
#ifdef CONFIG_DECONVOLUTION_FLOAT32
    f->exec_func = exec_deconvolution;
#endif /* CONFIG_DECONVOLUTION_FLOAT32 */
  } else {
#ifdef CONFIG_DECONVOLUTION_GENERIC
    f->exec_func = exec_deconvolution_generic;
#endif /* CONFIG_DECONVOLUTION_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}